

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  pointer pcVar1;
  pointer pbVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  size_type *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar12;
  string suffix;
  string dir;
  string cmd;
  string cdCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  string cdStr;
  string check_error;
  string currentBinDir;
  string workingDir;
  string local_1b0;
  string local_190;
  cmGhsMultiTargetGenerator *local_170;
  ulong local_168;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  uint local_11c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  ostream *local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = this;
  local_f8 = fout;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + psVar5->_M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_90,ccg);
  if (local_90._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_190);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"if [[ $? -ne 0 ]]; then exit 1; fi","");
  pcVar6 = cmCustomCommandGenerator::GetComment(ccg);
  if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"echo ","");
    std::__cxx11::string::append((char *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"cd ","");
  cmOutputConverter::ConvertToOutputFormat
            (&local_1b0,&(local_170->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter
             ,&local_190,SHELL);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_f0[0])
  ;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160.field_2._8_8_ = plVar7[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_160._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_140,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &local_140);
  local_168 = 0;
  do {
    uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    pbVar2 = local_118.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 <= (uint)local_168) {
      for (; pbVar12 != pbVar2; pbVar12 = pbVar12 + 1) {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_f8,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_f8,(char *)local_d0,local_c8);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_160,ccg,(uint)local_168);
    if (local_160._M_string_length != 0) {
      if (local_170->CmdWindowsShell == true) {
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_local_buf[0] = '\0';
        if (local_160._M_string_length < 5) {
LAB_00226cf4:
          unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_160);
          cmsys::SystemTools::LowerCase(&local_50,&local_70);
          std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1b0);
          if ((iVar4 != 0) &&
             (iVar4 = std::__cxx11::string::compare((char *)&local_1b0), iVar4 != 0))
          goto LAB_00226cf4;
          unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      cmsys::SystemTools::ReplaceString(&local_160,"/./","/");
      lVar8 = std::__cxx11::string::find((char)&local_160,0x2f);
      if (local_90._M_string_length == 0) {
        local_11c = (uint)unaff_R13;
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_1b0,&local_170->LocalGenerator->super_cmLocalGenerator,&local_b0,
                   &local_160);
        std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
        unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)local_11c;
      }
      lVar9 = std::__cxx11::string::find((char)&local_160,0x2f);
      if ((lVar8 != -1) && (lVar9 == -1)) {
        std::operator+(&local_1b0,"./",&local_160);
        std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_1b0,
                 &(local_170->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 &local_160,SHELL);
      std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                 local_1b0.field_2._M_local_buf[0]) + 1);
      }
      if ((char)unaff_R13 != '\0') {
        unaff_R13 = &local_1b0;
        std::operator+(unaff_R13,"call ",&local_160);
        std::__cxx11::string::operator=((string *)&local_160,(string *)unaff_R13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                   local_1b0.field_2._M_local_buf[0]) + 1);
        }
      }
      cmCustomCommandGenerator::AppendArguments(ccg,(uint)local_168,&local_160);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 &local_160);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    local_168 = (ulong)((int)local_168 + 1);
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string currentBinDir = dir;
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [[ $? -ne 0 ]]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = "echo ";
    echocmd += comment;
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->CmdWindowsShell) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd =
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = "call " + cmd;
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << std::endl;
    fout << check_error << std::endl;
  }
}